

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

TestFactoryBase * __thiscall
testing::internal::TestMetaFactory<RenderTest_RadianceMatches_Test>::CreateTestFactory
          (TestMetaFactory<RenderTest_RadianceMatches_Test> *this,ParamType *parameter)

{
  pointer pcVar1;
  ParameterizedTestFactory<RenderTest_RadianceMatches_Test> *this_00;
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  PrimitiveHandle local_68;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_60;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  float local_28;
  
  this_00 = (ParameterizedTestFactory<RenderTest_RadianceMatches_Test> *)operator_new(0x80);
  local_98._0_8_ = parameter->integrator;
  local_98._8_8_ = (parameter->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  pcVar1 = (parameter->description)._M_dataplus._M_p;
  local_88._M_p = (pointer)&local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + (parameter->description)._M_string_length);
  local_68.
  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  .bits = (TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
           )(parameter->scene).aggregate.
            super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
            .bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            (&local_60,&(parameter->scene).lights);
  pcVar1 = (parameter->scene).description._M_dataplus._M_p;
  local_48._M_p = (pointer)&local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (parameter->scene).description._M_string_length);
  local_28 = (parameter->scene).expected;
  ParameterizedTestFactory<RenderTest_RadianceMatches_Test>::ParameterizedTestFactory
            (this_00,(ParamType *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  if (local_60.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
  }
  return &this_00->super_TestFactoryBase;
}

Assistant:

virtual TestFactoryBase* CreateTestFactory(ParamType parameter) {
    return new ParameterizedTestFactory<TestCase>(parameter);
  }